

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O3

REF_STATUS ref_export_faceid_range(REF_GRID ref_grid,REF_INT *min_faceid,REF_INT *max_faceid)

{
  REF_CELL pRVar1;
  int in_EAX;
  int iVar2;
  REF_INT cell;
  int iVar3;
  REF_INT nodes [27];
  REF_INT aRStack_a8 [30];
  
  *min_faceid = 0x7fffffff;
  *max_faceid = -0x80000000;
  pRVar1 = ref_grid->cell[3];
  if (0 < pRVar1->max) {
    cell = 0;
    do {
      in_EAX = ref_cell_nodes(pRVar1,cell,aRStack_a8);
      if (in_EAX == 0) {
        iVar3 = aRStack_a8[pRVar1->node_per];
        if (*min_faceid < aRStack_a8[pRVar1->node_per]) {
          iVar3 = *min_faceid;
        }
        *min_faceid = iVar3;
        in_EAX = *max_faceid;
        iVar3 = aRStack_a8[pRVar1->node_per];
        if (aRStack_a8[pRVar1->node_per] < in_EAX) {
          iVar3 = in_EAX;
        }
        *max_faceid = iVar3;
      }
      cell = cell + 1;
    } while (cell < pRVar1->max);
  }
  pRVar1 = ref_grid->cell[6];
  if (0 < pRVar1->max) {
    iVar3 = 0;
    do {
      in_EAX = ref_cell_nodes(pRVar1,iVar3,aRStack_a8);
      if (in_EAX == 0) {
        iVar2 = aRStack_a8[pRVar1->node_per];
        if (*min_faceid < aRStack_a8[pRVar1->node_per]) {
          iVar2 = *min_faceid;
        }
        *min_faceid = iVar2;
        in_EAX = *max_faceid;
        iVar2 = aRStack_a8[pRVar1->node_per];
        if (aRStack_a8[pRVar1->node_per] < in_EAX) {
          iVar2 = in_EAX;
        }
        *max_faceid = iVar2;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < pRVar1->max);
  }
  return in_EAX;
}

Assistant:

REF_FCN static REF_STATUS ref_export_faceid_range(REF_GRID ref_grid,
                                                  REF_INT *min_faceid,
                                                  REF_INT *max_faceid) {
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_faceid = REF_INT_MAX;
  *max_faceid = REF_INT_MIN;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_faceid = MIN(*min_faceid, nodes[ref_cell_id_index(ref_cell)]);
    *max_faceid = MAX(*max_faceid, nodes[ref_cell_id_index(ref_cell)]);
  }